

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorLinearGradient::ReleaseElementData
          (DecoratorLinearGradient *this,DecoratorDataHandle handle)

{
  Pool<Rml::ShaderElementData> *this_00;
  ShaderElementData *element_data;
  DecoratorDataHandle handle_local;
  DecoratorLinearGradient *this_local;
  
  this_00 = GetShaderElementDataPool();
  Pool<Rml::ShaderElementData>::DestroyAndDeallocate(this_00,(ShaderElementData *)handle);
  return;
}

Assistant:

void DecoratorLinearGradient::ReleaseElementData(DecoratorDataHandle handle) const
{
	ShaderElementData* element_data = reinterpret_cast<ShaderElementData*>(handle);
	GetShaderElementDataPool().DestroyAndDeallocate(element_data);
}